

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Point2f pbrt::InvertUniformTriangleSample(array<float,_3> *b)

{
  float *pfVar1;
  array<float,_3> *in_RDI;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  float fVar2;
  undefined4 in_stack_ffffffffffffffe0;
  float fVar3;
  undefined4 in_stack_ffffffffffffffe4;
  undefined8 local_8;
  
  pfVar1 = pstd::array<float,_3>::operator[](in_RDI,0);
  fVar2 = *pfVar1;
  pfVar1 = pstd::array<float,_3>::operator[](in_RDI,1);
  if (fVar2 <= *pfVar1) {
    pfVar1 = pstd::array<float,_3>::operator[](in_RDI,0);
    fVar3 = *pfVar1 * 2.0;
    pfVar1 = pstd::array<float,_3>::operator[](in_RDI,1);
    fVar2 = *pfVar1;
    pstd::array<float,_3>::operator[](in_RDI,0);
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_ffffffffffffffe4,fVar3),fVar2,
               in_stack_ffffffffffffffd8);
  }
  else {
    pfVar1 = pstd::array<float,_3>::operator[](in_RDI,0);
    fVar2 = *pfVar1;
    pstd::array<float,_3>::operator[](in_RDI,1);
    pstd::array<float,_3>::operator[](in_RDI,1);
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(fVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
               in_stack_ffffffffffffffd8);
  }
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
inline Point2f InvertUniformTriangleSample(const pstd::array<Float, 3> &b) {
    if (b[0] > b[1]) {
        // b0 = u[0] - u[1] / 2, b1 = u[1] / 2
        return {b[0] + b[1], 2 * b[1]};
    } else {
        // b1 = u[1] - u[0] / 2, b0 = u[0] / 2
        return {2 * b[0], b[1] + b[0]};
    }
}